

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::~QComboBox(QComboBox *this)

{
  bool bVar1;
  QComboBoxPrivate *this_00;
  QComboBoxPrivateContainer *pQVar2;
  int in_ESI;
  undefined8 *in_RDI;
  QComboBoxPrivate *d;
  QWidget *in_stack_00000068;
  QComboBoxPrivateContainer *in_stack_ffffffffffffffd8;
  
  *in_RDI = &PTR_metaObject_00d10a80;
  in_RDI[2] = &PTR__QComboBox_00d10c50;
  this_00 = d_func((QComboBox *)0x5377ab);
  QComboBoxPrivate::disconnectModel(this_00);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x5377cb);
  if (bVar1) {
    pQVar2 = QPointer<QComboBoxPrivateContainer>::operator->
                       ((QPointer<QComboBoxPrivateContainer> *)0x5377e2);
    QWidget::close((QWidget *)pQVar2,in_ESI);
    pQVar2 = ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
                       ((QPointer<QComboBoxPrivateContainer> *)0x5377fb);
    if (pQVar2 != (QComboBoxPrivateContainer *)0x0) {
      (**(code **)(*(long *)&(pQVar2->super_QFrame).super_QWidget + 0x20))();
    }
    QPointer<QComboBoxPrivateContainer>::operator=
              ((QPointer<QComboBoxPrivateContainer> *)pQVar2,in_stack_ffffffffffffffd8);
  }
  QWidget::~QWidget(in_stack_00000068);
  return;
}

Assistant:

QComboBox::~QComboBox()
{
    // ### check delegateparent and delete delegate if us?
    Q_D(QComboBox);

    QT_TRY {
        d->disconnectModel();
    }